

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_asn1.cc
# Opt level: O3

DH * DH_parse_parameters(CBS *cbs)

{
  int iVar1;
  int iVar2;
  DH *dh;
  CBS child;
  uint64_t priv_length;
  CBS CStack_28;
  ulong local_18;
  
  dh = DH_new();
  if (dh == (DH *)0x0) {
    return (DH *)0x0;
  }
  iVar1 = CBS_get_asn1(cbs,&CStack_28,0x20000010);
  if (((iVar1 == 0) || (iVar1 = parse_integer(&CStack_28,(BIGNUM **)dh), iVar1 == 0)) ||
     (iVar1 = parse_integer(&CStack_28,(BIGNUM **)&dh->p), iVar1 == 0)) {
    iVar1 = 0x38;
    goto LAB_00210196;
  }
  if (CStack_28.len != 0) {
    iVar2 = CBS_get_asn1_uint64(&CStack_28,&local_18);
    iVar1 = 0x40;
    if (local_18 >> 0x20 != 0 || iVar2 == 0) goto LAB_00210196;
    *(int *)&dh->priv_key = (int)local_18;
    iVar1 = 0x47;
    if (CStack_28.len != 0) goto LAB_00210196;
  }
  iVar1 = dh_check_params_fast((DH *)dh);
  if (iVar1 != 0) {
    return (DH *)dh;
  }
  iVar1 = 0x4c;
LAB_00210196:
  ERR_put_error(5,0,0x68,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_asn1.cc"
                ,iVar1);
  DH_free(dh);
  return (DH *)0x0;
}

Assistant:

DH *DH_parse_parameters(CBS *cbs) {
  bssl::UniquePtr<DH> ret(DH_new());
  if (ret == nullptr) {
    return nullptr;
  }

  CBS child;
  if (!CBS_get_asn1(cbs, &child, CBS_ASN1_SEQUENCE) ||
      !parse_integer(&child, &ret->p) ||
      !parse_integer(&child, &ret->g)) {
    OPENSSL_PUT_ERROR(DH, DH_R_DECODE_ERROR);
    return nullptr;
  }

  uint64_t priv_length;
  if (CBS_len(&child) != 0) {
    if (!CBS_get_asn1_uint64(&child, &priv_length) ||
        priv_length > UINT_MAX) {
      OPENSSL_PUT_ERROR(DH, DH_R_DECODE_ERROR);
      return nullptr;
    }
    ret->priv_length = (unsigned)priv_length;
  }

  if (CBS_len(&child) != 0) {
    OPENSSL_PUT_ERROR(DH, DH_R_DECODE_ERROR);
    return nullptr;
  }

  if (!dh_check_params_fast(ret.get())) {
    OPENSSL_PUT_ERROR(DH, DH_R_DECODE_ERROR);
    return nullptr;
  }

  return ret.release();
}